

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Server.h
# Opt level: O1

void __thiscall
Altumo::FastCgi::Server::handle_accept(Server *this,Session *new_session,error_code *error)

{
  mutable_buffers_1 local_38;
  bind_t<void,_boost::_mfi::mf2<void,_Altumo::FastCgi::Session,_const_boost::system::error_code_&,_unsigned_long>,_boost::_bi::list3<boost::_bi::value<Altumo::FastCgi::Session_*>,_boost::arg<1>_(*)(),_boost::arg<2>_(*)()>_>
  local_28;
  
  if (error->failed_ == false) {
    local_38.super_mutable_buffer.data_ = new_session->data_;
    local_38.super_mutable_buffer.size_ = 0x400;
    local_28.f_.f_ = (F)Session::handle_read;
    local_28.f_._8_8_ = 0;
    local_28.l_.
    super_storage3<boost::_bi::value<Altumo::FastCgi::Session_*>,_boost::arg<1>_(*)(),_boost::arg<2>_(*)()>
    .super_storage2<boost::_bi::value<Altumo::FastCgi::Session_*>,_boost::arg<1>_(*)()>.
    super_storage1<boost::_bi::value<Altumo::FastCgi::Session_*>_>.a1_.t_ =
         (storage3<boost::_bi::value<Altumo::FastCgi::Session_*>,_boost::arg<1>_(*)(),_boost::arg<2>_(*)()>
          )(storage3<boost::_bi::value<Altumo::FastCgi::Session_*>,_boost::arg<1>_(*)(),_boost::arg<2>_(*)()>
            )new_session;
    boost::asio::detail::reactive_socket_service_base::
    async_receive<boost::asio::mutable_buffers_1,boost::_bi::bind_t<void,boost::_mfi::mf2<void,Altumo::FastCgi::Session,boost::system::error_code_const&,unsigned_long>,boost::_bi::list3<boost::_bi::value<Altumo::FastCgi::Session*>,boost::arg<1>(*)(),boost::arg<2>(*)()>>,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
              (&((new_session->socket_).
                 super_basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                 .impl_.service_)->super_reactive_socket_service_base,
               &(new_session->socket_).
                super_basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                .impl_.implementation_.super_base_implementation_type,&local_38,0,&local_28,
               &(new_session->socket_).
                super_basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                .impl_.executor_);
  }
  else if (new_session != (Session *)0x0) {
    Session::~Session(new_session);
    operator_delete(new_session,0x6a0);
  }
  start_accept(this);
  return;
}

Assistant:

void handle_accept( Session* new_session, const boost::system::error_code& error ){

                    if( !error ){
                        new_session->start();
                    }else{
                        delete new_session;
                    }

                    start_accept();

                }